

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

void __thiscall
presolve::HPresolve::substitute
          (HPresolve *this,HighsInt substcol,HighsInt staycol,double offset,double scale)

{
  double dVar1;
  int row;
  HighsLp *pHVar2;
  pointer pdVar3;
  char *__name;
  int iVar4;
  double dVar5;
  double dVar6;
  
  iVar4 = (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[substcol];
  while (iVar4 != -1) {
    __name = (char *)(long)iVar4;
    row = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[(long)__name];
    dVar6 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[(long)__name];
    iVar4 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(long)__name];
    unlink(this,__name);
    pHVar2 = this->model;
    pdVar3 = (pHVar2->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar1 = pdVar3[row];
    dVar5 = dVar6 * offset;
    if (-INFINITY < dVar1) {
      pdVar3[row] = dVar1 - dVar5;
    }
    pdVar3 = (pHVar2->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar1 = pdVar3[row];
    if (dVar1 < INFINITY) {
      pdVar3[row] = dVar1 - dVar5;
    }
    addToMatrix(this,row,staycol,dVar6 * scale);
    reinsertEquation(this,row);
  }
  pHVar2 = this->model;
  pdVar3 = (pHVar2->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar6 = pdVar3[substcol];
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    pHVar2->offset_ = dVar6 * offset + pHVar2->offset_;
    dVar6 = scale * pdVar3[substcol] + pdVar3[staycol];
    pdVar3[staycol] = dVar6;
    if (ABS(dVar6) <= (this->options->super_HighsOptionsStruct).small_matrix_value) {
      pdVar3[staycol] = 0.0;
    }
    pdVar3[substcol] = 0.0;
  }
  return;
}

Assistant:

void HPresolve::substitute(HighsInt substcol, HighsInt staycol, double offset,
                           double scale) {
  // substitute the column in each row where it occurs
  for (HighsInt coliter = colhead[substcol]; coliter != -1;) {
    HighsInt colrow = Arow[coliter];
    double colval = Avalue[coliter];
    // walk to the next position before doing any modifications, because
    // the current position will be deleted in the loop below
    assert(Acol[coliter] == substcol);
    HighsInt colpos = coliter;
    coliter = Anext[coliter];
    assert(!rowDeleted[colrow]);
    unlink(colpos);

    // adjust the sides
    if (model->row_lower_[colrow] != -kHighsInf)
      model->row_lower_[colrow] -= colval * offset;

    if (model->row_upper_[colrow] != kHighsInf)
      model->row_upper_[colrow] -= colval * offset;

    addToMatrix(colrow, staycol, scale * colval);
    // printf("after substitution: ");
    // debugPrintRow(colrow);

    // check if this is an equation row and it now has a different size
    reinsertEquation(colrow);
  }

  // substitute column in the objective function
  if (model->col_cost_[substcol] != 0.0) {
    model->offset_ += model->col_cost_[substcol] * offset;
    assert(std::isfinite(model->offset_));

    model->col_cost_[staycol] += scale * model->col_cost_[substcol];

    if (std::abs(model->col_cost_[staycol]) <= options->small_matrix_value)
      model->col_cost_[staycol] = 0.0;
    model->col_cost_[substcol] = 0.0;
  }
}